

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O2

void get_msurf_descriptor_haar_unroll_1_12_False(integral_image *iimage,interest_point *ipoint)

{
  long lVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  byte bVar21;
  int i;
  int iVar22;
  int iVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  int iVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  float *pfVar35;
  int k0;
  long lVar36;
  long lVar37;
  float *pfVar38;
  float *pfVar39;
  int iVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  float fVar54;
  float fVar55;
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar71;
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar78;
  undefined1 auVar79 [16];
  undefined1 auVar81 [12];
  undefined1 auVar80 [64];
  undefined1 auVar82 [64];
  float fVar83;
  undefined1 in_ZMM8 [64];
  undefined1 in_ZMM9 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar86;
  undefined1 auVar87 [64];
  
  auVar49._8_4_ = 0x3effffff;
  auVar49._0_8_ = 0x3effffff3effffff;
  auVar49._12_4_ = 0x3effffff;
  auVar48._8_4_ = 0x80000000;
  auVar48._0_8_ = 0x8000000080000000;
  auVar48._12_4_ = 0x80000000;
  auVar82 = ZEXT1664(auVar48);
  fVar56 = ipoint->scale;
  auVar87 = ZEXT464((uint)fVar56);
  auVar45 = ZEXT816(0x3fe0000000000000);
  auVar80 = ZEXT1664(auVar45);
  auVar50 = ZEXT416((uint)fVar56);
  auVar41 = vpternlogd_avx512vl(auVar49,auVar50,auVar48,0xf8);
  auVar41 = ZEXT416((uint)(fVar56 + auVar41._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  fVar54 = -0.08 / (fVar56 * fVar56);
  iVar28 = (int)auVar41._0_4_;
  auVar42._0_4_ = (int)auVar41._0_4_;
  auVar42._4_4_ = (int)auVar41._4_4_;
  auVar42._8_4_ = (int)auVar41._8_4_;
  auVar42._12_4_ = (int)auVar41._12_4_;
  auVar41 = vcvtdq2ps_avx(auVar42);
  auVar42 = vpternlogd_avx512vl(auVar49,ZEXT416((uint)ipoint->x),auVar48,0xf8);
  auVar42 = ZEXT416((uint)(ipoint->x + auVar42._0_4_));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  auVar43._0_8_ = (double)auVar42._0_4_;
  auVar43._8_8_ = auVar42._8_8_;
  auVar47._0_8_ = (double)fVar56;
  auVar47._8_8_ = 0;
  auVar42 = vfmadd231sd_fma(auVar43,auVar47,auVar45);
  auVar46._0_4_ = (float)auVar42._0_8_;
  auVar46._4_12_ = auVar42._4_12_;
  auVar42 = vpternlogd_avx512vl(auVar49,ZEXT416((uint)ipoint->y),auVar48,0xf8);
  fVar3 = auVar46._0_4_ - auVar41._0_4_;
  auVar42 = ZEXT416((uint)(ipoint->y + auVar42._0_4_));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  auVar43 = ZEXT416((uint)fVar3);
  auVar44._0_8_ = (double)auVar42._0_4_;
  auVar44._8_8_ = auVar42._8_8_;
  auVar42 = vfmadd231sd_fma(auVar44,auVar47,auVar45);
  auVar45._0_4_ = (float)auVar42._0_8_;
  auVar45._4_12_ = auVar42._4_12_;
  fVar86 = auVar45._0_4_ - auVar41._0_4_;
  auVar44 = ZEXT416((uint)fVar56);
  auVar41 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar44,auVar46);
  auVar42 = vpternlogd_avx512vl(auVar49,auVar41,auVar48,0xf8);
  auVar41 = ZEXT416((uint)(auVar41._0_4_ + auVar42._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  if (iVar28 < (int)auVar41._0_4_) {
    auVar51._8_4_ = 0x3effffff;
    auVar51._0_8_ = 0x3effffff3effffff;
    auVar51._12_4_ = 0x3effffff;
    auVar52._8_4_ = 0x80000000;
    auVar52._0_8_ = 0x8000000080000000;
    auVar52._12_4_ = 0x80000000;
    auVar41 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar44,auVar45);
    auVar42 = vpternlogd_avx512vl(auVar52,auVar41,auVar51,0xea);
    auVar41 = ZEXT416((uint)(auVar41._0_4_ + auVar42._0_4_));
    auVar41 = vroundss_avx(auVar41,auVar41,0xb);
    if (iVar28 < (int)auVar41._0_4_) {
      auVar41 = vfmadd231ss_fma(auVar46,auVar44,ZEXT416(0x41300000));
      auVar74._8_4_ = 0x80000000;
      auVar74._0_8_ = 0x8000000080000000;
      auVar74._12_4_ = 0x80000000;
      auVar42 = vpternlogd_avx512vl(auVar74,auVar41,auVar51,0xea);
      auVar41 = ZEXT416((uint)(auVar41._0_4_ + auVar42._0_4_));
      auVar41 = vroundss_avx(auVar41,auVar41,0xb);
      if ((int)auVar41._0_4_ + iVar28 <= iimage->width) {
        auVar41 = vfmadd231ss_fma(auVar45,auVar44,ZEXT416(0x41300000));
        auVar12._8_4_ = 0x80000000;
        auVar12._0_8_ = 0x8000000080000000;
        auVar12._12_4_ = 0x80000000;
        auVar42 = vpternlogd_avx512vl(auVar51,auVar41,auVar12,0xf8);
        auVar41 = ZEXT416((uint)(auVar41._0_4_ + auVar42._0_4_));
        auVar41 = vroundss_avx(auVar41,auVar41,0xb);
        if ((int)auVar41._0_4_ + iVar28 <= iimage->height) {
          fVar3 = fVar3 + 0.5;
          iVar23 = -0xc;
          lVar37 = 0x2c;
          for (lVar25 = 0; lVar25 != 0x18; lVar25 = lVar25 + 1) {
            auVar41._0_4_ = (float)iVar23;
            auVar41._4_12_ = in_ZMM8._4_12_;
            auVar41 = vfmadd213ss_fma(auVar41,auVar87._0_16_,ZEXT416((uint)(fVar86 + 0.5)));
            iVar40 = (int)auVar41._0_4_;
            lVar36 = lVar37;
            for (iVar22 = -0xc; iVar22 < 0xc; iVar22 = iVar22 + 0xc) {
              auVar58._0_4_ = (float)iVar22;
              auVar81 = in_ZMM8._4_12_;
              auVar58._4_12_ = auVar81;
              auVar41 = vfmadd213ss_fma(auVar58,auVar50,ZEXT416((uint)fVar3));
              auVar59._0_4_ = (float)(iVar22 + 1);
              auVar59._4_12_ = auVar81;
              auVar42 = vfmadd213ss_fma(auVar59,auVar50,ZEXT416((uint)fVar3));
              auVar60._0_4_ = (float)(iVar22 + 2);
              auVar60._4_12_ = auVar81;
              auVar46 = ZEXT416((uint)fVar3);
              auVar43 = vfmadd213ss_fma(auVar60,auVar50,auVar46);
              auVar61._0_4_ = (float)(iVar22 + 3);
              auVar61._4_12_ = auVar82._4_12_;
              auVar44 = vfmadd213ss_fma(auVar61,auVar50,auVar46);
              auVar62._0_4_ = (float)(iVar22 + 4);
              auVar81 = auVar80._4_12_;
              auVar62._4_12_ = auVar81;
              auVar45 = vfmadd213ss_fma(auVar62,auVar50,auVar46);
              auVar63._0_4_ = (float)(iVar22 + 5);
              auVar63._4_12_ = auVar81;
              auVar46 = vfmadd213ss_fma(auVar63,auVar50,auVar46);
              auVar64._0_4_ = (float)(iVar22 + 6);
              auVar64._4_12_ = auVar81;
              auVar74 = ZEXT416((uint)fVar3);
              auVar47 = vfmadd213ss_fma(auVar64,auVar50,auVar74);
              auVar65._0_4_ = (float)(iVar22 + 7);
              auVar65._4_12_ = auVar81;
              auVar48 = vfmadd213ss_fma(auVar65,auVar50,auVar74);
              auVar66._0_4_ = (float)(iVar22 + 8);
              auVar66._4_12_ = auVar81;
              auVar49 = vfmadd213ss_fma(auVar66,auVar50,auVar74);
              auVar67._0_4_ = (float)(iVar22 + 9);
              auVar67._4_12_ = auVar81;
              auVar51 = vfmadd213ss_fma(auVar67,auVar50,auVar74);
              auVar68._0_4_ = (float)(iVar22 + 10);
              auVar68._4_12_ = auVar81;
              auVar52 = vfmadd213ss_fma(auVar68,auVar50,auVar74);
              auVar69._0_4_ = (float)(iVar22 + 0xb);
              auVar69._4_12_ = auVar81;
              auVar74 = vfmadd213ss_fma(auVar69,auVar50,auVar74);
              haarXY_unconditional
                        (iimage,iVar40,(int)auVar41._0_4_,iVar28,
                         (float *)((long)haarResponseX + lVar36 + -0x2c),
                         (float *)((long)haarResponseY + lVar36 + -0x2c));
              haarXY_unconditional
                        (iimage,iVar40,(int)auVar42._0_4_,iVar28,
                         (float *)((long)haarResponseX + lVar36 + -0x28),
                         (float *)((long)haarResponseY + lVar36 + -0x28));
              haarXY_unconditional
                        (iimage,iVar40,(int)auVar43._0_4_,iVar28,
                         (float *)((long)haarResponseX + lVar36 + -0x24),
                         (float *)((long)haarResponseY + lVar36 + -0x24));
              haarXY_unconditional
                        (iimage,iVar40,(int)auVar44._0_4_,iVar28,
                         (float *)((long)haarResponseX + lVar36 + -0x20),
                         (float *)((long)haarResponseY + lVar36 + -0x20));
              haarXY_unconditional
                        (iimage,iVar40,(int)auVar45._0_4_,iVar28,
                         (float *)((long)haarResponseX + lVar36 + -0x1c),
                         (float *)((long)haarResponseY + lVar36 + -0x1c));
              haarXY_unconditional
                        (iimage,iVar40,(int)auVar46._0_4_,iVar28,
                         (float *)((long)haarResponseX + lVar36 + -0x18),
                         (float *)((long)haarResponseY + lVar36 + -0x18));
              haarXY_unconditional
                        (iimage,iVar40,(int)auVar47._0_4_,iVar28,
                         (float *)((long)haarResponseX + lVar36 + -0x14),
                         (float *)((long)haarResponseY + lVar36 + -0x14));
              haarXY_unconditional
                        (iimage,iVar40,(int)auVar48._0_4_,iVar28,
                         (float *)((long)haarResponseX + lVar36 + -0x10),
                         (float *)((long)haarResponseY + lVar36 + -0x10));
              haarXY_unconditional
                        (iimage,iVar40,(int)auVar49._0_4_,iVar28,
                         (float *)((long)haarResponseX + lVar36 + -0xc),
                         (float *)((long)haarResponseY + lVar36 + -0xc));
              haarXY_unconditional
                        (iimage,iVar40,(int)auVar51._0_4_,iVar28,
                         (float *)((long)haarResponseX + lVar36 + -8),
                         (float *)((long)haarResponseY + lVar36 + -8));
              haarXY_unconditional
                        (iimage,iVar40,(int)auVar52._0_4_,iVar28,
                         (float *)((long)haarResponseX + lVar36 + -4),
                         (float *)((long)haarResponseY + lVar36 + -4));
              haarXY_unconditional
                        (iimage,iVar40,(int)auVar74._0_4_,iVar28,
                         (float *)((long)haarResponseX + lVar36),
                         (float *)((long)haarResponseY + lVar36));
              lVar36 = lVar36 + 0x30;
            }
            auVar87 = ZEXT1664(auVar50);
            iVar23 = iVar23 + 1;
            lVar37 = lVar37 + 0x60;
          }
          goto LAB_00163e97;
        }
      }
    }
  }
  iVar23 = -0xc;
  lVar37 = 0x2c;
  for (lVar25 = 0; lVar25 != 0x18; lVar25 = lVar25 + 1) {
    auVar57._0_4_ = (float)iVar23;
    auVar57._4_12_ = in_ZMM8._4_12_;
    auVar41 = vfmadd213ss_fma(auVar57,auVar87._0_16_,ZEXT416((uint)fVar86));
    fVar55 = auVar41._0_4_;
    iVar40 = (int)((double)((ulong)(0.0 <= fVar55) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar55) * -0x4020000000000000) + (double)fVar55);
    lVar36 = lVar37;
    for (iVar22 = -0xc; iVar22 < 0xc; iVar22 = iVar22 + 0xc) {
      auVar53 = vpbroadcastd_avx512vl();
      auVar53 = vpaddd_avx2(auVar53,_DAT_002716c0);
      auVar70._0_4_ = (float)iVar22;
      auVar81 = in_ZMM9._4_12_;
      auVar70._4_12_ = auVar81;
      auVar41 = vfmadd213ss_fma(auVar70,auVar50,auVar43);
      auVar73._0_4_ = (float)(iVar22 + 1);
      auVar73._4_12_ = auVar81;
      auVar42 = vfmadd213ss_fma(auVar73,auVar50,auVar43);
      auVar76._0_4_ = (float)(iVar22 + 2);
      auVar76._4_12_ = auVar81;
      auVar44 = vfmadd213ss_fma(auVar76,auVar50,auVar43);
      auVar79._0_4_ = (float)(iVar22 + 3);
      auVar79._4_12_ = auVar81;
      auVar45 = vfmadd213ss_fma(auVar79,auVar50,auVar43);
      fVar55 = auVar41._0_4_;
      fVar71 = auVar42._0_4_;
      fVar75 = auVar44._0_4_;
      fVar78 = auVar45._0_4_;
      auVar53 = vcvtdq2ps_avx(auVar53);
      auVar19._4_4_ = fVar3;
      auVar19._0_4_ = fVar3;
      auVar19._8_4_ = fVar3;
      auVar19._12_4_ = fVar3;
      auVar19._16_4_ = fVar3;
      auVar19._20_4_ = fVar3;
      auVar19._24_4_ = fVar3;
      auVar19._28_4_ = fVar3;
      auVar20._4_4_ = fVar56;
      auVar20._0_4_ = fVar56;
      auVar20._8_4_ = fVar56;
      auVar20._12_4_ = fVar56;
      auVar20._16_4_ = fVar56;
      auVar20._20_4_ = fVar56;
      auVar20._24_4_ = fVar56;
      auVar20._28_4_ = fVar56;
      auVar48 = vfmadd132ps_fma(auVar53,auVar19,auVar20);
      uVar27 = vcmpps_avx512vl(ZEXT1632(auVar48),_DAT_002716e0,0xd);
      auVar46 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xff);
      bVar14 = (byte)(uVar27 >> 6);
      bVar15 = (byte)(uVar27 >> 5);
      bVar16 = (byte)(uVar27 >> 4);
      bVar17 = (byte)(uVar27 >> 3);
      bVar18 = (byte)(uVar27 >> 2);
      bVar21 = (byte)(uVar27 >> 1);
      bVar11 = (bool)((byte)(uVar27 >> 7) & 1);
      auVar44 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,1);
      auVar41 = vmovshdup_avx((undefined1  [16])0x0);
      auVar47 = vshufps_avx(auVar48,auVar48,0xff);
      auVar45 = vshufpd_avx(auVar48,auVar48,1);
      auVar42 = vmovshdup_avx(auVar48);
      in_ZMM8 = ZEXT1664(ZEXT816(0x3fe0000000000000));
      in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
      haarXY_precheck_boundaries
                (iimage,iVar40,
                 (int)((double)((ulong)(0.0 <= fVar55) * 0x3fe0000000000000 +
                               (ulong)(0.0 > fVar55) * -0x4020000000000000) + (double)fVar55),iVar28
                 ,(float *)((long)haarResponseX + lVar36 + -0x2c),
                 (float *)((long)haarResponseY + lVar36 + -0x2c));
      haarXY_precheck_boundaries
                (iimage,iVar40,
                 (int)((double)((ulong)(0.0 <= fVar71) * 0x3fe0000000000000 +
                               (ulong)(0.0 > fVar71) * -0x4020000000000000) + (double)fVar71),iVar28
                 ,(float *)((long)haarResponseX + lVar36 + -0x28),
                 (float *)((long)haarResponseY + lVar36 + -0x28));
      haarXY_precheck_boundaries
                (iimage,iVar40,
                 (int)((double)((ulong)(0.0 <= fVar75) * 0x3fe0000000000000 +
                               (ulong)(0.0 > fVar75) * -0x4020000000000000) + (double)fVar75),iVar28
                 ,(float *)((long)haarResponseX + lVar36 + -0x24),
                 (float *)((long)haarResponseY + lVar36 + -0x24));
      haarXY_precheck_boundaries
                (iimage,iVar40,
                 (int)((double)((ulong)(0.0 <= fVar78) * 0x3fe0000000000000 +
                               (ulong)(0.0 > fVar78) * -0x4020000000000000) + (double)fVar78),iVar28
                 ,(float *)((long)haarResponseX + lVar36 + -0x20),
                 (float *)((long)haarResponseY + lVar36 + -0x20));
      haarXY_precheck_boundaries
                (iimage,iVar40,
                 (int)((double)((ulong)bVar11 * 0x3fe0000000000000 +
                               (ulong)!bVar11 * -0x4020000000000000) + (double)auVar46._0_4_),iVar28
                 ,(float *)((long)haarResponseX + lVar36 + -0x1c),
                 (float *)((long)haarResponseY + lVar36 + -0x1c));
      haarXY_precheck_boundaries
                (iimage,iVar40,
                 (int)((double)((ulong)(bVar14 & 1) * 0x3fe0000000000000 +
                               (ulong)!(bool)(bVar14 & 1) * -0x4020000000000000) +
                      (double)auVar44._0_4_),iVar28,(float *)((long)haarResponseX + lVar36 + -0x18),
                 (float *)((long)haarResponseY + lVar36 + -0x18));
      haarXY_precheck_boundaries
                (iimage,iVar40,
                 (int)((double)((ulong)(bVar15 & 1) * 0x3fe0000000000000 +
                               (ulong)!(bool)(bVar15 & 1) * -0x4020000000000000) +
                      (double)auVar41._0_4_),iVar28,(float *)((long)haarResponseX + lVar36 + -0x14),
                 (float *)((long)haarResponseY + lVar36 + -0x14));
      haarXY_precheck_boundaries
                (iimage,iVar40,
                 (int)((double)((ulong)(bVar16 & 1) * 0x3fe0000000000000 +
                               (ulong)!(bool)(bVar16 & 1) * -0x4020000000000000) + 0.0),iVar28,
                 (float *)((long)haarResponseX + lVar36 + -0x10),
                 (float *)((long)haarResponseY + lVar36 + -0x10));
      haarXY_precheck_boundaries
                (iimage,iVar40,
                 (int)((double)((ulong)(bVar17 & 1) * 0x3fe0000000000000 +
                               (ulong)!(bool)(bVar17 & 1) * -0x4020000000000000) +
                      (double)auVar47._0_4_),iVar28,(float *)((long)haarResponseX + lVar36 + -0xc),
                 (float *)((long)haarResponseY + lVar36 + -0xc));
      haarXY_precheck_boundaries
                (iimage,iVar40,
                 (int)((double)((ulong)(bVar18 & 1) * 0x3fe0000000000000 +
                               (ulong)!(bool)(bVar18 & 1) * -0x4020000000000000) +
                      (double)auVar45._0_4_),iVar28,(float *)((long)haarResponseX + lVar36 + -8),
                 (float *)((long)haarResponseY + lVar36 + -8));
      haarXY_precheck_boundaries
                (iimage,iVar40,
                 (int)((double)((ulong)(bVar21 & 1) * 0x3fe0000000000000 +
                               (ulong)!(bool)(bVar21 & 1) * -0x4020000000000000) +
                      (double)auVar42._0_4_),iVar28,(float *)((long)haarResponseX + lVar36 + -4),
                 (float *)((long)haarResponseY + lVar36 + -4));
      haarXY_precheck_boundaries
                (iimage,iVar40,
                 (int)((double)((ulong)((byte)uVar27 & 1) * 0x3fe0000000000000 +
                               (ulong)!(bool)((byte)uVar27 & 1) * -0x4020000000000000) +
                      (double)auVar48._0_4_),iVar28,(float *)((long)haarResponseX + lVar36),
                 (float *)((long)haarResponseY + lVar36));
      lVar36 = lVar36 + 0x30;
    }
    auVar87 = ZEXT1664(auVar50);
    iVar23 = iVar23 + 1;
    lVar37 = lVar37 + 0x60;
  }
LAB_00163e97:
  fVar86 = auVar87._0_4_;
  auVar85._8_4_ = 0x3effffff;
  auVar85._0_8_ = 0x3effffff3effffff;
  auVar85._12_4_ = 0x3effffff;
  auVar84._8_4_ = 0x80000000;
  auVar84._0_8_ = 0x8000000080000000;
  auVar84._12_4_ = 0x80000000;
  auVar41 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 0.5)),auVar84,0xf8);
  auVar41 = ZEXT416((uint)(fVar86 * 0.5 + auVar41._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  auVar42 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 1.5)),auVar84,0xf8);
  auVar42 = ZEXT416((uint)(fVar86 * 1.5 + auVar42._0_4_));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  auVar43 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 2.5)),auVar84,0xf8);
  auVar43 = ZEXT416((uint)(fVar86 * 2.5 + auVar43._0_4_));
  auVar43 = vroundss_avx(auVar43,auVar43,0xb);
  auVar44 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 3.5)),auVar84,0xf8);
  auVar44 = ZEXT416((uint)(fVar86 * 3.5 + auVar44._0_4_));
  auVar44 = vroundss_avx(auVar44,auVar44,0xb);
  auVar45 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 4.5)),auVar84,0xf8);
  auVar45 = ZEXT416((uint)(fVar86 * 4.5 + auVar45._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  auVar46 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 5.5)),auVar84,0xf8);
  auVar46 = ZEXT416((uint)(fVar86 * 5.5 + auVar46._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar47 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 6.5)),auVar84,0xf8);
  auVar47 = ZEXT416((uint)(fVar86 * 6.5 + auVar47._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar48 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 7.5)),auVar84,0xf8);
  auVar48 = ZEXT416((uint)(auVar48._0_4_ + fVar86 * 7.5));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 8.5)),auVar84,0xf8);
  auVar49 = ZEXT416((uint)(fVar86 * 8.5 + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 9.5)),auVar84,0xf8);
  auVar50 = ZEXT416((uint)(fVar86 * 9.5 + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 10.5)),auVar84,0xf8);
  auVar51 = ZEXT416((uint)(fVar86 * 10.5 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52 = vpternlogd_avx512vl(auVar85,ZEXT416((uint)(fVar86 * 11.5)),auVar84,0xf8);
  fVar72 = auVar43._0_4_;
  fVar56 = fVar72 + auVar42._0_4_;
  fVar3 = fVar72 + auVar41._0_4_;
  auVar43 = ZEXT416((uint)(fVar86 * 11.5 + auVar52._0_4_));
  auVar43 = vroundss_avx(auVar43,auVar43,0xb);
  fVar86 = fVar72 - auVar41._0_4_;
  fVar55 = fVar72 - auVar42._0_4_;
  fVar71 = fVar72 - auVar44._0_4_;
  fVar75 = fVar72 - auVar45._0_4_;
  fVar78 = fVar72 - auVar46._0_4_;
  fVar72 = fVar72 - auVar47._0_4_;
  fVar83 = auVar48._0_4_;
  fVar4 = fVar83 - auVar44._0_4_;
  fVar5 = fVar83 - auVar45._0_4_;
  fVar6 = fVar83 - auVar46._0_4_;
  fVar7 = fVar83 - auVar47._0_4_;
  fVar8 = fVar83 - auVar49._0_4_;
  fVar9 = fVar83 - auVar50._0_4_;
  fVar10 = fVar83 - auVar51._0_4_;
  fVar83 = fVar83 - auVar43._0_4_;
  gauss_s1_c0[0] = expf(fVar56 * fVar56 * fVar54);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar54);
  gauss_s1_c0[2] = expf(fVar86 * fVar86 * fVar54);
  gauss_s1_c0[3] = expf(fVar55 * fVar55 * fVar54);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar71 * fVar71 * fVar54);
  gauss_s1_c0[6] = expf(fVar75 * fVar75 * fVar54);
  gauss_s1_c0[7] = expf(fVar78 * fVar78 * fVar54);
  gauss_s1_c0[8] = expf(fVar72 * fVar72 * fVar54);
  gauss_s1_c1[0] = expf(fVar4 * fVar4 * fVar54);
  gauss_s1_c1[1] = expf(fVar5 * fVar5 * fVar54);
  gauss_s1_c1[2] = expf(fVar6 * fVar6 * fVar54);
  gauss_s1_c1[3] = expf(fVar7 * fVar7 * fVar54);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar8 * fVar8 * fVar54);
  gauss_s1_c1[6] = expf(fVar9 * fVar9 * fVar54);
  gauss_s1_c1[7] = expf(fVar10 * fVar10 * fVar54);
  gauss_s1_c1[8] = expf(fVar83 * fVar83 * fVar54);
  auVar80 = ZEXT1264(ZEXT812(0));
  lVar37 = 0;
  auVar50._8_4_ = 0x7fffffff;
  auVar50._0_8_ = 0x7fffffff7fffffff;
  auVar50._12_4_ = 0x7fffffff;
  iVar28 = 0;
  lVar25 = 0;
  uVar27 = 0xfffffffffffffff8;
  while (uVar24 = (uint)uVar27, (int)uVar24 < 8) {
    pfVar38 = gauss_s1_c1;
    if (uVar24 != 7) {
      pfVar38 = gauss_s1_c0;
    }
    lVar36 = (long)iVar28;
    lVar25 = (long)(int)lVar25;
    iVar28 = iVar28 + 4;
    if (uVar24 == 0xfffffff8) {
      pfVar38 = gauss_s1_c1;
    }
    uVar29 = 0;
    uVar34 = 0xfffffffffffffff8;
    lVar30 = lVar37;
    while (lVar36 != iVar28) {
      pfVar39 = gauss_s1_c1;
      iVar23 = (int)uVar34;
      if (iVar23 != 7) {
        pfVar39 = gauss_s1_c0;
      }
      auVar82 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar34 = (ulong)((uint)(uVar34 >> 0x1c) & 8);
      if (iVar23 == -8) {
        pfVar39 = gauss_s1_c1;
      }
      lVar31 = (long)haarResponseX + lVar30;
      lVar32 = (long)haarResponseY + lVar30;
      for (uVar26 = uVar29; uVar26 < iVar23 * 0x18 + 0x198; uVar26 = uVar26 + 0x18) {
        lVar33 = 0;
        pfVar35 = (float *)((long)pfVar38 + (ulong)(((uint)(uVar27 >> 0x1f) & 1) << 5));
        while (lVar33 != 9) {
          fVar56 = *pfVar35;
          pfVar35 = pfVar35 + (ulong)(~uVar24 >> 0x1f) * 2 + -1;
          lVar1 = lVar33 * 4;
          lVar2 = lVar33 * 4;
          lVar33 = lVar33 + 1;
          auVar43 = ZEXT416((uint)(pfVar39[uVar34] * fVar56 * *(float *)(lVar31 + lVar2)));
          auVar41 = vandps_avx(auVar43,auVar50);
          auVar44 = ZEXT416((uint)(pfVar39[uVar34] * fVar56 * *(float *)(lVar32 + lVar1)));
          auVar42 = vandps_avx(auVar44,auVar50);
          auVar43 = vinsertps_avx(auVar44,auVar43,0x10);
          auVar42 = vmovlhps_avx(auVar43,auVar42);
          auVar41 = vinsertps_avx(auVar42,auVar41,0x30);
          auVar82 = ZEXT1664(CONCAT412(auVar82._12_4_ + auVar41._12_4_,
                                       CONCAT48(auVar82._8_4_ + auVar41._8_4_,
                                                CONCAT44(auVar82._4_4_ + auVar41._4_4_,
                                                         auVar82._0_4_ + auVar41._0_4_))));
        }
        uVar34 = uVar34 + (ulong)(-1 < iVar23) * 2 + -1;
        lVar31 = lVar31 + 0x60;
        lVar32 = lVar32 + 0x60;
      }
      uVar34 = (ulong)(iVar23 + 5);
      uVar29 = uVar29 + 0x78;
      lVar30 = lVar30 + 0x1e0;
      fVar56 = gauss_s2_arr[lVar36];
      auVar13._4_4_ = fVar56;
      auVar13._0_4_ = fVar56;
      auVar13._8_4_ = fVar56;
      auVar13._12_4_ = fVar56;
      auVar44 = vmulps_avx512vl(auVar82._0_16_,auVar13);
      lVar36 = lVar36 + 1;
      auVar77._0_4_ = auVar44._0_4_ * auVar44._0_4_;
      auVar77._4_4_ = auVar44._4_4_ * auVar44._4_4_;
      auVar77._8_4_ = auVar44._8_4_ * auVar44._8_4_;
      auVar77._12_4_ = auVar44._12_4_ * auVar44._12_4_;
      auVar42 = vshufpd_avx(auVar44,auVar44,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar25) = auVar44;
      lVar25 = lVar25 + 4;
      auVar41 = vmovshdup_avx(auVar77);
      auVar43 = vfmadd231ss_fma(auVar41,auVar44,auVar44);
      auVar41 = vshufps_avx(auVar44,auVar44,0xff);
      auVar42 = vfmadd213ss_fma(auVar42,auVar42,auVar43);
      auVar41 = vfmadd213ss_fma(auVar41,auVar41,auVar42);
      auVar80 = ZEXT464((uint)(auVar80._0_4_ + auVar41._0_4_));
    }
    lVar37 = lVar37 + 0x14;
    uVar27 = (ulong)(uVar24 + 5);
  }
  if (auVar80._0_4_ < 0.0) {
    fVar56 = sqrtf(auVar80._0_4_);
  }
  else {
    auVar41 = vsqrtss_avx(auVar80._0_16_,auVar80._0_16_);
    fVar56 = auVar41._0_4_;
  }
  for (lVar37 = 0; lVar37 != 0x40; lVar37 = lVar37 + 1) {
    ipoint->descriptor[lVar37] = (1.0 / fVar56) * ipoint->descriptor[lVar37];
  }
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_1_12_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=12, k_count+=12) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k8 = k + 8;
                int k9 = k + 9;
                int k10 = k + 10;
                int k11 = k + 11;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                int k_count8 = k_count + 8;
                int k_count9 = k_count + 9;
                int k_count10 = k_count + 10;
                int k_count11 = k_count + 11;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                float ipoint_x_sub_int_scale_add_k6_mul_scale = ipoint_x_sub_int_scale + k6 * scale;
                float ipoint_x_sub_int_scale_add_k7_mul_scale = ipoint_x_sub_int_scale + k7 * scale;
                float ipoint_x_sub_int_scale_add_k8_mul_scale = ipoint_x_sub_int_scale + k8 * scale;
                float ipoint_x_sub_int_scale_add_k9_mul_scale = ipoint_x_sub_int_scale + k9 * scale;
                float ipoint_x_sub_int_scale_add_k10_mul_scale = ipoint_x_sub_int_scale + k10 * scale;
                float ipoint_x_sub_int_scale_add_k11_mul_scale = ipoint_x_sub_int_scale + k11 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_k4_mul_scale + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_k5_mul_scale + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_k6_mul_scale + (ipoint_x_sub_int_scale_add_k6_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_k7_mul_scale + (ipoint_x_sub_int_scale_add_k7_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale8 = (int) (ipoint_x_sub_int_scale_add_k8_mul_scale + (ipoint_x_sub_int_scale_add_k8_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale9 = (int) (ipoint_x_sub_int_scale_add_k9_mul_scale + (ipoint_x_sub_int_scale_add_k9_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale10 = (int) (ipoint_x_sub_int_scale_add_k10_mul_scale + (ipoint_x_sub_int_scale_add_k10_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale11 = (int) (ipoint_x_sub_int_scale_add_k11_mul_scale + (ipoint_x_sub_int_scale_add_k11_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count0*24+k_count8], &haarResponseY[l_count0*24+k_count8]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count0*24+k_count9], &haarResponseY[l_count0*24+k_count9]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count0*24+k_count10], &haarResponseY[l_count0*24+k_count10]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count0*24+k_count11], &haarResponseY[l_count0*24+k_count11]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);

            for (int k=-12, k_count=0; k<12; k+=12, k_count+=12) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k8 = k + 8;
                int k9 = k + 9;
                int k10 = k + 10;
                int k11 = k + 11;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                int k_count8 = k_count + 8;
                int k_count9 = k_count + 9;
                int k_count10 = k_count + 10;
                int k_count11 = k_count + 11;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_05 + k6 * scale);
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_05 + k7 * scale);
                int sample_x_sub_int_scale8 = (int) (ipoint_x_sub_int_scale_add_05 + k8 * scale);
                int sample_x_sub_int_scale9 = (int) (ipoint_x_sub_int_scale_add_05 + k9 * scale);
                int sample_x_sub_int_scale10 = (int) (ipoint_x_sub_int_scale_add_05 + k10 * scale);
                int sample_x_sub_int_scale11 = (int) (ipoint_x_sub_int_scale_add_05 + k11 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale8, int_scale, &haarResponseX[l_count0*24+k_count8], &haarResponseY[l_count0*24+k_count8]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale9, int_scale, &haarResponseX[l_count0*24+k_count9], &haarResponseY[l_count0*24+k_count9]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale10, int_scale, &haarResponseX[l_count0*24+k_count10], &haarResponseY[l_count0*24+k_count10]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale11, int_scale, &haarResponseX[l_count0*24+k_count11], &haarResponseY[l_count0*24+k_count11]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}